

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O0

GLFWbool createNativeWindow(_GLFWwindow *window,_GLFWwndconfig *wndconfig,Visual *visual,int depth)

{
  GLFWbool GVar1;
  __pid_t _Var2;
  undefined8 uVar3;
  undefined8 *puVar4;
  size_t sVar5;
  char *__s;
  int in_ECX;
  int iVar6;
  char in_RDX [8];
  undefined4 *in_RSI;
  long in_RDI;
  Atom version;
  char *resourceName;
  XClassHint *hint;
  XWMHints *hints;
  Atom type;
  long pid;
  Atom protocols [2];
  int count;
  Atom states [3];
  unsigned_long wamask;
  XSetWindowAttributes wa;
  char *in_stack_000002c8;
  int in_stack_000002d4;
  undefined8 in_stack_fffffffffffffec8;
  uint uVar8;
  Atom *pAVar7;
  undefined8 in_stack_fffffffffffffed0;
  undefined4 uVar10;
  undefined8 uVar9;
  _GLFWwindow *window_00;
  undefined4 in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffedc;
  char ypos [8];
  int *xpos;
  _GLFWwindow *window_01;
  undefined1 local_108 [4];
  GLFWbool enabled;
  _GLFWwindow *in_stack_ffffffffffffff00;
  Atom local_e8;
  Atom local_e0;
  char *title;
  _GLFWwindow *window_02;
  uint local_bc;
  Atom local_b8;
  int *in_stack_ffffffffffffff50;
  int *in_stack_ffffffffffffff58;
  _GLFWwindow *window_03;
  undefined1 local_98 [136];
  long local_10;
  GLFWbool local_4;
  
  enabled = (GLFWbool)((ulong)_local_108 >> 0x20);
  uVar10 = (undefined4)((ulong)in_stack_fffffffffffffed0 >> 0x20);
  uVar8 = (uint)((ulong)in_stack_fffffffffffffec8 >> 0x20);
  local_98._116_4_ = in_ECX;
  local_98._120_8_ = in_RDX;
  local_98._128_8_ = in_RSI;
  local_10 = in_RDI;
  uVar3 = XCreateColormap(_glfw.x11.display,_glfw.x11.root,in_RDX,0);
  *(undefined8 *)(local_10 + 0x338) = uVar3;
  GVar1 = _glfwIsVisualTransparentX11
                    ((Visual *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  *(GLFWbool *)(local_10 + 0x35c) = GVar1;
  window_03 = (_GLFWwindow *)0x2808;
  local_98._96_8_ = *(undefined8 *)(local_10 + 0x338);
  local_98._24_4_ = 0;
  local_98._28_4_ = 0;
  local_98._72_8_ = (_GLFWcursor *)0x63807f;
  _glfwGrabErrorHandlerX11();
  window_01 = (_GLFWwindow *)local_98;
  uVar9 = CONCAT44(uVar10,local_98._116_4_);
  xpos = (int *)0x2808;
  uVar3 = XCreateWindow(_glfw.x11.display,_glfw.x11.root,0,0,*(undefined4 *)local_98._128_8_,
                        *(undefined4 *)(local_98._128_8_ + 4),(ulong)uVar8 << 0x20,uVar9,1);
  uVar10 = (undefined4)((ulong)uVar9 >> 0x20);
  *(undefined8 *)(local_10 + 0x340) = uVar3;
  _glfwReleaseErrorHandlerX11();
  if (*(long *)(local_10 + 0x340) == 0) {
    _glfwInputErrorX11(in_stack_000002d4,in_stack_000002c8);
    local_4 = 0;
  }
  else {
    XSaveContext(_glfw.x11.display,*(undefined8 *)(local_10 + 0x340),_glfw.x11.context,local_10);
    ypos = (char  [8])local_98._120_8_;
    if (*(int *)(local_98._128_8_ + 0x18) == 0) {
      _glfwPlatformSetWindowDecorated(in_stack_ffffffffffffff00,enabled);
      ypos = (char  [8])local_98._120_8_;
    }
    if ((_glfw.x11.NET_WM_STATE != 0) && (*(long *)(local_10 + 0x40) == 0)) {
      local_bc = 0;
      if (*(int *)(local_98._128_8_ + 0x24) != 0) {
        if (_glfw.x11.NET_WM_STATE_ABOVE != 0) {
          local_b8 = _glfw.x11.NET_WM_STATE_ABOVE;
        }
        local_bc = (uint)(_glfw.x11.NET_WM_STATE_ABOVE != 0);
      }
      if (((*(int *)(local_98._128_8_ + 0x28) != 0) && (_glfw.x11.NET_WM_STATE_MAXIMIZED_VERT != 0))
         && (_glfw.x11.NET_WM_STATE_MAXIMIZED_HORZ != 0)) {
        iVar6 = local_bc + 1;
        (&local_b8)[(int)local_bc] = _glfw.x11.NET_WM_STATE_MAXIMIZED_VERT;
        local_bc = local_bc + 2;
        (&local_b8)[iVar6] = _glfw.x11.NET_WM_STATE_MAXIMIZED_HORZ;
        *(undefined4 *)(local_10 + 0x358) = 1;
      }
      if (local_bc != 0) {
        uVar3 = CONCAT44(uVar10,local_bc);
        XChangeProperty(_glfw.x11.display,*(undefined8 *)(local_10 + 0x340),_glfw.x11.NET_WM_STATE,4
                        ,0x20,0,&local_b8,uVar3);
        uVar10 = (undefined4)((ulong)uVar3 >> 0x20);
      }
    }
    title = (char *)_glfw.x11.WM_DELETE_WINDOW;
    window_02 = (_GLFWwindow *)_glfw.x11.NET_WM_PING;
    XSetWMProtocols(_glfw.x11.display,*(undefined8 *)(local_10 + 0x340),&stack0xffffffffffffff28,2);
    _Var2 = getpid();
    local_e0 = (Atom)_Var2;
    pAVar7 = &local_e0;
    window_00 = (_GLFWwindow *)CONCAT44(uVar10,1);
    XChangeProperty(_glfw.x11.display,*(undefined8 *)(local_10 + 0x340),_glfw.x11.NET_WM_PID,6,0x20,
                    0);
    if ((_glfw.x11.NET_WM_WINDOW_TYPE != 0) && (_glfw.x11.NET_WM_WINDOW_TYPE_NORMAL != 0)) {
      local_e8 = _glfw.x11.NET_WM_WINDOW_TYPE_NORMAL;
      pAVar7 = &local_e8;
      window_00 = (_GLFWwindow *)CONCAT44((int)((ulong)window_00 >> 0x20),1);
      XChangeProperty(_glfw.x11.display,*(undefined8 *)(local_10 + 0x340),
                      _glfw.x11.NET_WM_WINDOW_TYPE,4,0x20,0);
    }
    puVar4 = (undefined8 *)XAllocWMHints();
    if (puVar4 == (undefined8 *)0x0) {
      _glfwInputError(0x10005,"X11: Failed to allocate WM hints");
      local_4 = 0;
    }
    else {
      *puVar4 = 2;
      *(undefined4 *)((long)puVar4 + 0xc) = 1;
      XSetWMHints(_glfw.x11.display,*(undefined8 *)(local_10 + 0x340),puVar4);
      XFree(puVar4);
      updateNormalHints(window_00,(int)((ulong)pAVar7 >> 0x20),(int)pAVar7);
      uVar10 = (undefined4)((ulong)window_00 >> 0x20);
      puVar4 = (undefined8 *)XAllocClassHint();
      sVar5 = strlen((char *)(local_98._128_8_ + 0x238));
      if ((sVar5 == 0) || (sVar5 = strlen((char *)(local_98._128_8_ + 0x138)), sVar5 == 0)) {
        __s = getenv("RESOURCE_NAME");
        if ((__s == (char *)0x0) || (sVar5 = strlen(__s), sVar5 == 0)) {
          sVar5 = strlen(*(char **)(local_98._128_8_ + 8));
          if (sVar5 == 0) {
            *puVar4 = "glfw-application";
          }
          else {
            *puVar4 = *(undefined8 *)(local_98._128_8_ + 8);
          }
        }
        else {
          *puVar4 = __s;
        }
        sVar5 = strlen(*(char **)(local_98._128_8_ + 8));
        if (sVar5 == 0) {
          puVar4[1] = "GLFW-Application";
        }
        else {
          puVar4[1] = *(undefined8 *)(local_98._128_8_ + 8);
        }
      }
      else {
        *puVar4 = (undefined4 *)(local_98._128_8_ + 0x238);
        puVar4[1] = (undefined4 *)(local_98._128_8_ + 0x138);
      }
      XSetClassHint(_glfw.x11.display,*(undefined8 *)(local_10 + 0x340),puVar4);
      XFree(puVar4);
      _local_108 = 5;
      XChangeProperty(_glfw.x11.display,*(undefined8 *)(local_10 + 0x340),_glfw.x11.XdndAware,4,0x20
                      ,0,local_108,CONCAT44(uVar10,1));
      _glfwPlatformSetWindowTitle(window_02,title);
      if (_glfw.x11.im != (XIM)0x0) {
        uVar3 = XCreateIC(_glfw.x11.im,"inputStyle",0x408,"clientWindow",
                          *(undefined8 *)(local_10 + 0x340),"focusWindow",
                          *(undefined8 *)(local_10 + 0x340),0);
        *(undefined8 *)(local_10 + 0x348) = uVar3;
      }
      _glfwPlatformGetWindowPos(window_01,xpos,(int *)ypos);
      _glfwPlatformGetWindowSize(window_03,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

static GLFWbool createNativeWindow(_GLFWwindow* window,
                                   const _GLFWwndconfig* wndconfig,
                                   Visual* visual, int depth)
{
    // Create a colormap based on the visual used by the current context
    window->x11.colormap = XCreateColormap(_glfw.x11.display,
                                           _glfw.x11.root,
                                           visual,
                                           AllocNone);

    window->x11.transparent = _glfwIsVisualTransparentX11(visual);

    // Create the actual window
    {
        XSetWindowAttributes wa;
        const unsigned long wamask = CWBorderPixel | CWColormap | CWEventMask;

        wa.colormap = window->x11.colormap;
        wa.border_pixel = 0;
        wa.event_mask = StructureNotifyMask | KeyPressMask | KeyReleaseMask |
                        PointerMotionMask | ButtonPressMask | ButtonReleaseMask |
                        ExposureMask | FocusChangeMask | VisibilityChangeMask |
                        EnterWindowMask | LeaveWindowMask | PropertyChangeMask;

        _glfwGrabErrorHandlerX11();

        window->x11.handle = XCreateWindow(_glfw.x11.display,
                                           _glfw.x11.root,
                                           0, 0,
                                           wndconfig->width, wndconfig->height,
                                           0,      // Border width
                                           depth,  // Color depth
                                           InputOutput,
                                           visual,
                                           wamask,
                                           &wa);

        _glfwReleaseErrorHandlerX11();

        if (!window->x11.handle)
        {
            _glfwInputErrorX11(GLFW_PLATFORM_ERROR,
                               "X11: Failed to create window");
            return GLFW_FALSE;
        }

        XSaveContext(_glfw.x11.display,
                     window->x11.handle,
                     _glfw.x11.context,
                     (XPointer) window);
    }

    if (!wndconfig->decorated)
        _glfwPlatformSetWindowDecorated(window, GLFW_FALSE);

    if (_glfw.x11.NET_WM_STATE && !window->monitor)
    {
        Atom states[3];
        int count = 0;

        if (wndconfig->floating)
        {
            if (_glfw.x11.NET_WM_STATE_ABOVE)
                states[count++] = _glfw.x11.NET_WM_STATE_ABOVE;
        }

        if (wndconfig->maximized)
        {
            if (_glfw.x11.NET_WM_STATE_MAXIMIZED_VERT &&
                _glfw.x11.NET_WM_STATE_MAXIMIZED_HORZ)
            {
                states[count++] = _glfw.x11.NET_WM_STATE_MAXIMIZED_VERT;
                states[count++] = _glfw.x11.NET_WM_STATE_MAXIMIZED_HORZ;
                window->x11.maximized = GLFW_TRUE;
            }
        }

        if (count)
        {
            XChangeProperty(_glfw.x11.display, window->x11.handle,
                            _glfw.x11.NET_WM_STATE, XA_ATOM, 32,
                            PropModeReplace, (unsigned char*) &states, count);
        }
    }

    // Declare the WM protocols supported by GLFW
    {
        Atom protocols[] =
        {
            _glfw.x11.WM_DELETE_WINDOW,
            _glfw.x11.NET_WM_PING
        };

        XSetWMProtocols(_glfw.x11.display, window->x11.handle,
                        protocols, sizeof(protocols) / sizeof(Atom));
    }

    // Declare our PID
    {
        const long pid = getpid();

        XChangeProperty(_glfw.x11.display,  window->x11.handle,
                        _glfw.x11.NET_WM_PID, XA_CARDINAL, 32,
                        PropModeReplace,
                        (unsigned char*) &pid, 1);
    }

    if (_glfw.x11.NET_WM_WINDOW_TYPE && _glfw.x11.NET_WM_WINDOW_TYPE_NORMAL)
    {
        Atom type = _glfw.x11.NET_WM_WINDOW_TYPE_NORMAL;
        XChangeProperty(_glfw.x11.display,  window->x11.handle,
                        _glfw.x11.NET_WM_WINDOW_TYPE, XA_ATOM, 32,
                        PropModeReplace, (unsigned char*) &type, 1);
    }

    // Set ICCCM WM_HINTS property
    {
        XWMHints* hints = XAllocWMHints();
        if (!hints)
        {
            _glfwInputError(GLFW_OUT_OF_MEMORY,
                            "X11: Failed to allocate WM hints");
            return GLFW_FALSE;
        }

        hints->flags = StateHint;
        hints->initial_state = NormalState;

        XSetWMHints(_glfw.x11.display, window->x11.handle, hints);
        XFree(hints);
    }

    updateNormalHints(window, wndconfig->width, wndconfig->height);

    // Set ICCCM WM_CLASS property
    {
        XClassHint* hint = XAllocClassHint();

        if (strlen(wndconfig->x11.instanceName) &&
            strlen(wndconfig->x11.className))
        {
            hint->res_name = (char*) wndconfig->x11.instanceName;
            hint->res_class = (char*) wndconfig->x11.className;
        }
        else
        {
            const char* resourceName = getenv("RESOURCE_NAME");
            if (resourceName && strlen(resourceName))
                hint->res_name = (char*) resourceName;
            else if (strlen(wndconfig->title))
                hint->res_name = (char*) wndconfig->title;
            else
                hint->res_name = (char*) "glfw-application";

            if (strlen(wndconfig->title))
                hint->res_class = (char*) wndconfig->title;
            else
                hint->res_class = (char*) "GLFW-Application";
        }

        XSetClassHint(_glfw.x11.display, window->x11.handle, hint);
        XFree(hint);
    }

    // Announce support for Xdnd (drag and drop)
    {
        const Atom version = _GLFW_XDND_VERSION;
        XChangeProperty(_glfw.x11.display, window->x11.handle,
                        _glfw.x11.XdndAware, XA_ATOM, 32,
                        PropModeReplace, (unsigned char*) &version, 1);
    }

    _glfwPlatformSetWindowTitle(window, wndconfig->title);

    if (_glfw.x11.im)
    {
        window->x11.ic = XCreateIC(_glfw.x11.im,
                                   XNInputStyle,
                                   XIMPreeditNothing | XIMStatusNothing,
                                   XNClientWindow,
                                   window->x11.handle,
                                   XNFocusWindow,
                                   window->x11.handle,
                                   NULL);
    }

    _glfwPlatformGetWindowPos(window, &window->x11.xpos, &window->x11.ypos);
    _glfwPlatformGetWindowSize(window, &window->x11.width, &window->x11.height);

    return GLFW_TRUE;
}